

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal_dist.hpp
# Opt level: O1

result_type_conflict2 __thiscall
trng::normal_dist<double>::cdf(normal_dist<double> *this,result_type_conflict2 x)

{
  double dVar1;
  result_type_conflict2 rVar2;
  
  dVar1 = ((x - (this->P).mu_) / (this->P).sigma_) * 0.7071067811865476;
  if (-0.4769362762044699 <= dVar1) {
    if (dVar1 <= 0.4769362762044699) {
      dVar1 = erf(dVar1);
      rVar2 = dVar1 * 0.5 + 0.5;
    }
    else {
      dVar1 = erfc(dVar1);
      rVar2 = dVar1 * -0.5 + 1.0;
    }
  }
  else {
    dVar1 = erfc(-dVar1);
    rVar2 = dVar1 * 0.5;
  }
  return rVar2;
}

Assistant:

cdf(result_type x) const {
      x -= P.mu();
      x /= P.sigma();
      return math::Phi(x);
    }